

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDA.hpp
# Opt level: O2

void __thiscall
PCCompatible::MDA::CRTCOutputter::perform_bus_cycle_phase1(CRTCOutputter *this,BusState *state)

{
  byte bVar1;
  OutputState OVar2;
  uint uVar3;
  long *plVar4;
  uint8_t *puVar5;
  byte bVar6;
  byte bVar7;
  OutputState OVar8;
  byte bVar9;
  int number_of_cycles;
  byte bVar10;
  byte bVar11;
  
  OVar8 = Sync;
  if (state->vsync == false && state->hsync == false) {
    OVar8 = Border;
    if (state->display_enable != false) {
      OVar8 = ((this->control_ & 8) == 0) + Pixels;
    }
  }
  OVar2 = this->output_state;
  number_of_cycles = this->count;
  if (0x372 < number_of_cycles || OVar8 != OVar2) {
    if (number_of_cycles != 0) {
      if (OVar2 == Border) {
        Outputs::CRT::CRT::output_blank(&this->crt,number_of_cycles);
      }
      else if (OVar2 == Pixels) {
        Outputs::CRT::CRT::output_data(&this->crt,number_of_cycles);
        this->pixels = (uint8_t *)0x0;
        this->pixel_pointer = (uint8_t *)0x0;
      }
      else if (OVar2 == Sync) {
        Outputs::CRT::CRT::output_sync(&this->crt,number_of_cycles);
      }
    }
    this->output_state = OVar8;
    this->count = 0;
    number_of_cycles = 0;
  }
  if (OVar8 != Pixels) goto LAB_0033f8d6;
  if (this->pixels == (uint8_t *)0x0) {
    puVar5 = Outputs::CRT::CRT::begin_data(&this->crt,0x2d0,1);
    this->pixels = puVar5;
    this->pixel_pointer = puVar5;
    number_of_cycles = this->count;
    if (puVar5 == (uint8_t *)0x0) goto LAB_0033f8d6;
    if (number_of_cycles != 0) {
      Outputs::CRT::CRT::output_blank(&this->crt,number_of_cycles);
      this->count = 0;
      if (this->pixels == (uint8_t *)0x0) {
        number_of_cycles = 0;
        goto LAB_0033f8d6;
      }
    }
  }
  if (state->cursor == true) {
    this->pixel_pointer[8] = '\t';
    this->pixel_pointer[7] = '\t';
    this->pixel_pointer[6] = '\t';
    this->pixel_pointer[5] = '\t';
    this->pixel_pointer[4] = '\t';
    this->pixel_pointer[3] = '\t';
    this->pixel_pointer[2] = '\t';
    this->pixel_pointer[1] = '\t';
    *this->pixel_pointer = '\t';
  }
  else {
    uVar3._0_2_ = state->refresh_address;
    uVar3._2_2_ = state->row_address;
    bVar10 = this->ram[(ulong)(uVar3 & 0x7ff) * 2 + 1];
    bVar1 = this->ram[(ulong)(uVar3 & 0x7ff) * 2];
    bVar9 = (char)((bVar10 & 8) >> 3) << 2 | 9;
    if ((bVar10 == 0) || (bVar10 == 8)) {
LAB_0033f753:
      bVar11 = 0;
LAB_0033f756:
      bVar6 = 0;
    }
    else {
      bVar11 = (this->font).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start
               [(ulong)state->row_address + (ulong)bVar1 * 0xe];
      if ((bVar10 != 0x70) && (bVar10 != 0x78)) {
        if (bVar10 == 0x80) goto LAB_0033f753;
        if ((bVar10 == 0xf8) || (bVar10 == 0xf0)) goto LAB_0033f7b3;
        if (bVar10 == 0x88) goto LAB_0033f753;
        goto LAB_0033f756;
      }
LAB_0033f7b3:
      bVar11 = ~bVar11;
      bVar6 = bVar9;
    }
    bVar7 = bVar6;
    if ((((char)bVar10 < '\0') && ((this->control_ & 0x20) != 0)) &&
       ((state->field_count & 0x10) != 0)) {
      bVar11 = ~bVar11;
      bVar7 = 0;
      if (bVar6 == 0) {
        bVar7 = bVar9;
      }
    }
    if (state->row_address == 0xd && (bVar10 & 7) == 1) {
      plVar4 = (long *)this->pixel_pointer;
      *plVar4 = (ulong)bVar9 * 0x101010101010101;
      *(char *)(plVar4 + 1) = (char)((ulong)bVar9 * 0x101010101010101);
    }
    else {
      *this->pixel_pointer = bVar9 & (char)bVar11 >> 7;
      bVar10 = bVar11 & 0x40;
      if ((bVar11 & 0x40) != 0) {
        bVar10 = bVar9;
      }
      this->pixel_pointer[1] = bVar10;
      bVar10 = bVar11 & 0x20;
      if ((bVar11 & 0x20) != 0) {
        bVar10 = bVar9;
      }
      this->pixel_pointer[2] = bVar10;
      bVar10 = bVar11 & 0x10;
      if ((bVar11 & 0x10) != 0) {
        bVar10 = bVar9;
      }
      this->pixel_pointer[3] = bVar10;
      bVar10 = bVar11 & 8;
      if ((bVar11 & 8) != 0) {
        bVar10 = bVar9;
      }
      this->pixel_pointer[4] = bVar10;
      bVar10 = bVar11 & 4;
      if ((bVar11 & 4) != 0) {
        bVar10 = bVar9;
      }
      this->pixel_pointer[5] = bVar10;
      bVar10 = bVar11 & 2;
      if ((bVar11 & 2) != 0) {
        bVar10 = bVar9;
      }
      this->pixel_pointer[6] = bVar10;
      bVar10 = bVar11 & 1;
      if ((bVar11 & 1) != 0) {
        bVar10 = bVar9;
      }
      this->pixel_pointer[7] = bVar10;
      if ((bVar1 & 0xe0) == 0xc0) {
        bVar7 = this->pixel_pointer[7];
      }
      this->pixel_pointer[8] = bVar7;
    }
  }
  this->pixel_pointer = this->pixel_pointer + 9;
  number_of_cycles = this->count;
LAB_0033f8d6:
  this->count = number_of_cycles + 9;
  if ((this->output_state == Pixels) && (this->pixel_pointer == this->pixels + 0x2d0)) {
    Outputs::CRT::CRT::output_data(&this->crt,number_of_cycles + 9);
    *(undefined8 *)&this->count = 0;
    *(undefined8 *)((long)&this->pixels + 4) = 0;
    *(undefined4 *)((long)&this->pixel_pointer + 4) = 0;
  }
  return;
}

Assistant:

void perform_bus_cycle_phase1(const Motorola::CRTC::BusState &state) {
				// Determine new output state.
				const OutputState new_state =
					(state.hsync | state.vsync) ? OutputState::Sync :
						((state.display_enable && control_&0x08) ? OutputState::Pixels : OutputState::Border);

				// Upon either a state change or just having accumulated too much local time...
				if(new_state != output_state || count > 882) {
					// (1) flush preexisting state.
					if(count) {
						switch(output_state) {
							case OutputState::Sync:		crt.output_sync(count);		break;
							case OutputState::Border: 	crt.output_blank(count);	break;
							case OutputState::Pixels:
								crt.output_data(count);
								pixels = pixel_pointer = nullptr;
							break;
						}
					}

					// (2) adopt new state.
					output_state = new_state;
					count = 0;
				}

				// Collect pixels if applicable.
				if(output_state == OutputState::Pixels) {
					if(!pixels) {
						pixel_pointer = pixels = crt.begin_data(DefaultAllocationSize);

						// Flush any period where pixels weren't recorded due to back pressure.
						if(pixels && count) {
							crt.output_blank(count);
							count = 0;
						}
					}

					if(pixels) {
						static constexpr uint8_t high_intensity = 0x0d;
						static constexpr uint8_t low_intensity = 0x09;
						static constexpr uint8_t off = 0x00;

						if(state.cursor) {
							pixel_pointer[0] =	pixel_pointer[1] =	pixel_pointer[2] =	pixel_pointer[3] =
							pixel_pointer[4] =	pixel_pointer[5] =	pixel_pointer[6] =	pixel_pointer[7] =
							pixel_pointer[8] =	low_intensity;
						} else {
							const uint8_t attributes = ram[((state.refresh_address << 1) + 1) & 0xfff];
							const uint8_t glyph = ram[((state.refresh_address << 1) + 0) & 0xfff];
							uint8_t row = font[(glyph * 14) + state.row_address];

							const uint8_t intensity = (attributes & 0x08) ? high_intensity : low_intensity;
							uint8_t blank = off;

							// Handle irregular attributes.
							// Cf. http://www.seasip.info/VintagePC/mda.html#memmap
							switch(attributes) {
								case 0x00:	case 0x08:	case 0x80:	case 0x88:
									row = 0;
								break;
								case 0x70:	case 0x78:	case 0xf0:	case 0xf8:
									row ^= 0xff;
									blank = intensity;
								break;
							}

							// Apply blink if enabled.
							if((control_ & 0x20) && (attributes & 0x80) && (state.field_count & 16)) {
								row ^= 0xff;
								blank = (blank == off) ? intensity : off;
							}

							if(((attributes & 7) == 1) && state.row_address == 13) {
								// Draw as underline.
								std::fill(pixel_pointer, pixel_pointer + 9, intensity);
							} else {
								// Draw according to ROM contents, possibly duplicating final column.
								pixel_pointer[0] = (row & 0x80) ? intensity : off;
								pixel_pointer[1] = (row & 0x40) ? intensity : off;
								pixel_pointer[2] = (row & 0x20) ? intensity : off;
								pixel_pointer[3] = (row & 0x10) ? intensity : off;
								pixel_pointer[4] = (row & 0x08) ? intensity : off;
								pixel_pointer[5] = (row & 0x04) ? intensity : off;
								pixel_pointer[6] = (row & 0x02) ? intensity : off;
								pixel_pointer[7] = (row & 0x01) ? intensity : off;
								pixel_pointer[8] = (glyph >= 0xc0 && glyph < 0xe0) ? pixel_pointer[7] : blank;
							}
						}
						pixel_pointer += 9;
					}
				}

				// Advance.
				count += 9;

				// Output pixel row prematurely if storage is exhausted.
				if(output_state == OutputState::Pixels && pixel_pointer == pixels + DefaultAllocationSize) {
					crt.output_data(count);
					count = 0;

					pixels = pixel_pointer = nullptr;
				}
			}